

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O1

int coda_expression_is_equal(coda_expression *expr1,coda_expression *expr2)

{
  size_t __n;
  size_t sVar1;
  long lVar2;
  char *__s2;
  int iVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = expr1 == (coda_expression *)0x0 && expr2 == (coda_expression *)0x0;
  if (expr2 == (coda_expression *)0x0 || expr1 == (coda_expression *)0x0) goto LAB_0010f3b1;
  if (expr1->tag != expr2->tag) goto LAB_0010f3aa;
  switch(expr1->tag) {
  case expr_constant_boolean:
    bVar5 = expr1[1].tag == expr2[1].tag;
    break;
  case expr_constant_float:
    bVar5 = (bool)(-(*(double *)(expr2 + 1) == *(double *)(expr1 + 1)) & 1);
    break;
  case expr_constant_integer:
    lVar4._0_4_ = expr1[1].tag;
    lVar4._4_4_ = expr1[1].result_type;
    lVar2._0_4_ = expr2[1].tag;
    lVar2._4_4_ = expr2[1].result_type;
    bVar5 = lVar4 == lVar2;
    break;
  case expr_constant_rawstring:
  case expr_constant_string:
    __n._0_4_ = expr1[1].tag;
    __n._4_4_ = expr1[1].result_type;
    sVar1._0_4_ = expr2[1].tag;
    sVar1._4_4_ = expr2[1].result_type;
    if (__n == sVar1) {
      iVar3 = bcmp(*(void **)&expr1[1].is_constant,*(void **)&expr2[1].is_constant,__n);
      bVar5 = iVar3 == 0;
      break;
    }
    goto LAB_0010f3aa;
  default:
    __s2 = *(char **)(expr2 + 1);
    if (*(char **)(expr1 + 1) == (char *)0x0) {
      if (__s2 == (char *)0x0) goto LAB_0010f3ba;
    }
    else if ((__s2 != (char *)0x0) && (iVar3 = strcmp(*(char **)(expr1 + 1),__s2), iVar3 == 0)) {
LAB_0010f3ba:
      lVar4 = 0;
      do {
        iVar3 = coda_expression_is_equal
                          (*(coda_expression **)(&expr1[1].is_constant + lVar4 * 2),
                           *(coda_expression **)(&expr2[1].is_constant + lVar4 * 2));
        bVar5 = iVar3 != 0;
        if (iVar3 == 0) break;
        bVar6 = lVar4 != 3;
        lVar4 = lVar4 + 1;
      } while (bVar6);
      break;
    }
LAB_0010f3aa:
    bVar5 = false;
  }
LAB_0010f3b1:
  return (int)bVar5;
}

Assistant:

LIBCODA_API int coda_expression_is_equal(const coda_expression *expr1, const coda_expression *expr2)
{
    if (expr1 == NULL)
    {
        return expr2 == NULL;
    }
    if (expr2 == NULL)
    {
        return 0;
    }

    if (expr1->tag != expr2->tag)
    {
        return 0;
    }

    switch (expr1->tag)
    {
        case expr_constant_boolean:
            return ((coda_expression_bool_constant *)expr1)->value == ((coda_expression_bool_constant *)expr2)->value;
        case expr_constant_float:
            return ((coda_expression_float_constant *)expr1)->value == ((coda_expression_float_constant *)expr2)->value;
        case expr_constant_integer:
            return ((coda_expression_integer_constant *)expr1)->value ==
                ((coda_expression_integer_constant *)expr2)->value;
        case expr_constant_rawstring:
        case expr_constant_string:
            if (((coda_expression_string_constant *)expr1)->length !=
                ((coda_expression_string_constant *)expr2)->length)
            {
                return 0;
            }
            return memcmp(((coda_expression_string_constant *)expr1)->value,
                          ((coda_expression_string_constant *)expr2)->value,
                          ((coda_expression_string_constant *)expr1)->length) == 0;
        default:
            {
                coda_expression_operation *op1 = (coda_expression_operation *)expr1;
                coda_expression_operation *op2 = (coda_expression_operation *)expr2;
                int i;

                if (op1->identifier != NULL)
                {
                    if (op2->identifier == NULL)
                    {
                        return 0;
                    }
                    if (strcmp(op1->identifier, op2->identifier) != 0)
                    {
                        return 0;
                    }
                }
                else if (op2->identifier != NULL)
                {
                    return 0;
                }
                for (i = 0; i < 4; i++)
                {
                    if (!coda_expression_is_equal(op1->operand[i], op2->operand[i]))
                    {
                        return 0;
                    }
                }
            }
    }

    return 1;
}